

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O0

int __thiscall
TPZBlockDiagonal<double>::Put(TPZBlockDiagonal<double> *this,int64_t row,int64_t col,double *value)

{
  int iVar1;
  long lVar2;
  ostream *poVar3;
  undefined8 in_RCX;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  
  lVar2 = (**(code **)(*in_RDI + 0x60))();
  if ((((in_RSI < lVar2) && (lVar2 = (**(code **)(*in_RDI + 0x60))(), in_RDX < lVar2)) &&
      (-1 < in_RSI)) && (-1 < in_RDX)) {
    iVar1 = (**(code **)(*in_RDI + 0x118))(in_RDI,in_RSI,in_RDX,in_RCX);
    return iVar1;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"TPZBlockDiagonal::Put: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_RSI);
  poVar3 = std::operator<<(poVar3,",");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_RDX);
  poVar3 = std::operator<<(poVar3,",");
  lVar2 = (**(code **)(*in_RDI + 0x60))();
  std::ostream::operator<<(poVar3,lVar2);
  std::operator<<((ostream *)&std::cout,"\n");
  return 0;
}

Assistant:

int TPZBlockDiagonal<TVar>::Put(const int64_t row,const int64_t col,const TVar& value )
{
	//  cout << "TPZBlockDiagonal.Put should not be called\n";
	if ( (row >= Dim()) || (col >= Dim()) || row<0 || col<0)
    {
		cout << "TPZBlockDiagonal::Put: " << row << "," << col << "," << Dim();
		cout << "\n";
		return( 0 );
    }
	
	return( PutVal( row, col, value ) );
}